

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall
simple_json::Stream::statement_no_return<std::__cxx11::string>
          (Stream *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  uint uVar1;
  
  if (this->indent != 0) {
    uVar1 = 0;
    do {
      spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->indent);
  }
  spirv_cross::StringStream<4096UL,_4096UL>::append
            (&this->buffer,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}